

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O1

CaseResult * rc::detail::toCaseResult(CaseResult *__return_storage_ptr__,bool value)

{
  undefined1 *puVar1;
  string *psVar2;
  undefined7 in_register_00000031;
  string local_58;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,value) == 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Returned false","");
    CaseResult::CaseResult(__return_storage_ptr__,Failure,&local_58);
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Returned true","");
    CaseResult::CaseResult(__return_storage_ptr__,Success,&local_38);
  }
  if (value) {
    psVar2 = &local_38;
  }
  else {
    psVar2 = &local_58;
  }
  puVar1 = *(undefined1 **)((psVar2->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 != &psVar2->field_2) {
    operator_delete(puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

CaseResult toCaseResult(bool value) {
  return value ? CaseResult(CaseResult::Type::Success, "Returned true")
               : CaseResult(CaseResult::Type::Failure, "Returned false");
}